

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stream.cpp
# Opt level: O0

bool listdir(char *dirname,bool rel,char *ext,vector<char_*> *files)

{
  vector<char_*> *pvVar1;
  int iVar2;
  size_t sVar3;
  char *fmt;
  int local_16c;
  char *local_168;
  int local_15c;
  char *pcStack_158;
  int namelength;
  dirent64 *local_150;
  dirent *de;
  DIR *d;
  char local_138 [8];
  string pathname;
  int extsize;
  vector<char_*> *files_local;
  char *ext_local;
  bool rel_local;
  char *dirname_local;
  
  unique0x100001e8 = files;
  if (ext == (char *)0x0) {
    local_16c = 0;
  }
  else {
    sVar3 = strlen(ext);
    local_16c = (int)sVar3 + 1;
  }
  pathname[0xfc] = (undefined1)local_16c;
  pathname[0xfd] = local_16c._1_1_;
  pathname[0xfe] = local_16c._2_1_;
  pathname[0xff] = local_16c._3_1_;
  stringformatter::stringformatter((stringformatter *)&d,local_138);
  fmt = "%s";
  if (rel) {
    fmt = "./%s";
  }
  stringformatter::operator()((stringformatter *)&d,fmt,dirname);
  de = (dirent *)opendir(local_138);
  if (de == (dirent *)0x0) {
    dirname_local._7_1_ = false;
  }
  else {
    while (local_150 = readdir64((DIR *)de), pvVar1 = stack0xffffffffffffffd0,
          local_150 != (dirent64 *)0x0) {
      if (ext == (char *)0x0) {
        pcStack_158 = newstring(local_150->d_name);
        vector<char_*>::add(pvVar1,&stack0xfffffffffffffea8);
      }
      else {
        sVar3 = strlen(local_150->d_name);
        local_15c = (int)sVar3 - pathname._252_4_;
        if (((0 < local_15c) && (local_150->d_name[local_15c] == '.')) &&
           (iVar2 = strncmp(local_150->d_name + (long)local_15c + 1,ext,
                            (long)(pathname._252_4_ + -1)), pvVar1 = stack0xffffffffffffffd0,
           iVar2 == 0)) {
          local_168 = newstring(local_150->d_name,(long)local_15c);
          vector<char_*>::add(pvVar1,&local_168);
        }
      }
    }
    closedir((DIR *)de);
    dirname_local._7_1_ = true;
  }
  return dirname_local._7_1_;
}

Assistant:

bool listdir(const char *dirname, bool rel, const char *ext, vector<char *> &files)
{
    int extsize = ext ? (int)strlen(ext)+1 : 0;
    #ifdef WIN32
    defformatstring(pathname)(rel ? ".\\%s\\*.%s" : "%s\\*.%s", dirname, ext ? ext : "*");
    WIN32_FIND_DATA FindFileData;
    HANDLE Find = FindFirstFile(pathname, &FindFileData);
    if(Find != INVALID_HANDLE_VALUE)
    {
        do {
            if(!ext) files.add(newstring(FindFileData.cFileName));
            else
            {
                int namelength = (int)strlen(FindFileData.cFileName) - extsize;
                if(namelength > 0 && FindFileData.cFileName[namelength] == '.' && strncmp(FindFileData.cFileName+namelength+1, ext, extsize-1)==0)
                    files.add(newstring(FindFileData.cFileName, namelength));
            }
        } while(FindNextFile(Find, &FindFileData));
        FindClose(Find);
        return true;
    }
    #else
    defformatstring(pathname)(rel ? "./%s" : "%s", dirname);
    DIR *d = opendir(pathname);
    if(d)
    {
        struct dirent *de;
        while((de = readdir(d)) != NULL)
        {
            if(!ext) files.add(newstring(de->d_name));
            else
            {
                int namelength = (int)strlen(de->d_name) - extsize;
                if(namelength > 0 && de->d_name[namelength] == '.' && strncmp(de->d_name+namelength+1, ext, extsize-1)==0)
                    files.add(newstring(de->d_name, namelength));
            }
        }
        closedir(d);
        return true;
    }
    #endif
    else return false;
}